

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O2

void TTD::NSSnapObjects::
     ParseAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  SnapHeapArgumentsInfo *addtlInfo;
  TTD_PTR_ID TVar3;
  byte *pbVar4;
  uint32 i;
  ulong uVar5;
  
  addtlInfo = (SnapHeapArgumentsInfo *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  uVar1 = FileReader::ReadUInt32(reader,numberOfArgs,true);
  addtlInfo->NumOfArguments = uVar1;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  addtlInfo->IsFrameNullPtr = SUB41(iVar2,0);
  TVar3 = FileReader::ReadAddr(reader,objectId,true);
  addtlInfo->FrameObject = TVar3;
  uVar1 = FileReader::ReadLengthValue(reader,true);
  addtlInfo->FormalCount = uVar1;
  if (uVar1 == 0) {
    pbVar4 = (byte *)0x0;
  }
  else {
    pbVar4 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>(alloc,(ulong)uVar1);
  }
  addtlInfo->DeletedArgFlags = pbVar4;
  (*reader->_vptr_FileReader[3])(reader,0x48,1);
  (*reader->_vptr_FileReader[4])(reader,0);
  for (uVar5 = 0; uVar5 < addtlInfo->FormalCount; uVar5 = uVar5 + 1) {
    iVar2 = (*reader->_vptr_FileReader[9])(reader,(ulong)(uVar5 != 0));
    addtlInfo->DeletedArgFlags[uVar5] = (byte)iVar2;
  }
  (*reader->_vptr_FileReader[5])(reader);
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapHeapArgumentsInfo*,(TTD::NSSnapObjects::SnapObjectType)14>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapHeapArgumentsInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapHeapArgumentsInfo* argsInfo = alloc.SlabAllocateStruct<SnapHeapArgumentsInfo>();

            argsInfo->NumOfArguments = reader->ReadUInt32(NSTokens::Key::numberOfArgs, true);

            argsInfo->IsFrameNullPtr = reader->ReadBool(NSTokens::Key::boolVal, true);
            argsInfo->FrameObject = reader->ReadAddr(NSTokens::Key::objectId, true);

            argsInfo->FormalCount = reader->ReadLengthValue(true);

            if(argsInfo->FormalCount == 0)
            {
                argsInfo->DeletedArgFlags = nullptr;
            }
            else
            {
                argsInfo->DeletedArgFlags = alloc.SlabAllocateArray<byte>(argsInfo->FormalCount);
            }

            reader->ReadKey(NSTokens::Key::deletedArgs, true);
            reader->ReadSequenceStart();
            for(uint32 i = 0; i < argsInfo->FormalCount; ++i)
            {
                argsInfo->DeletedArgFlags[i] = reader->ReadNakedByte(i != 0);
            }
            reader->ReadSequenceEnd();

            SnapObjectSetAddtlInfoAs<SnapHeapArgumentsInfo*, argsKind>(snpObject, argsInfo);
        }